

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void draw_corners(Am_Drawonable *d,int rect_left,int rect_top,int rect_width,int rect_height)

{
  int iVar1;
  int iVar2;
  int yy2;
  int yy1;
  int xx2;
  int xx1;
  int y2;
  int x2;
  int y1;
  int x1;
  int half_width;
  int arc_width;
  int angle2;
  int angle1;
  int rect_height_local;
  int rect_width_local;
  int rect_top_local;
  int rect_left_local;
  Am_Drawonable *d_local;
  
  iVar1 = rect_left + rect_width;
  iVar2 = rect_top + rect_height;
  (**(code **)(*(long *)d + 0x130))(d,&black,&red,rect_left + -3,rect_top + -3,6,6,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&red,rect_left + -3,iVar2 + -3,6,6,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&red,iVar1 + -3,rect_top + -3,6,6,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&red,iVar1 + -3,iVar2 + -3,6,6,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x140))(d,&red,rect_left,rect_top,iVar1,rect_top,0);
  (**(code **)(*(long *)d + 0x140))(d,&red,rect_left,rect_top,rect_left,iVar2,0);
  (**(code **)(*(long *)d + 0x140))(d,&red,rect_left,iVar2,iVar1,iVar2,0);
  (**(code **)(*(long *)d + 0x140))(d,&red,iVar1,rect_top,iVar1,iVar2,0);
  return;
}

Assistant:

void
draw_corners(Am_Drawonable *d, int rect_left, int rect_top, int rect_width,
             int rect_height)
{
  int angle1 = 0;
  int angle2 = 360;
  int arc_width = 6;
  int half_width = arc_width / 2;
  int x1 = rect_left - half_width;
  int y1 = rect_top - half_width;
  int x2 = (rect_left + rect_width) - half_width;
  int y2 = (rect_top + rect_height) - half_width;

  d->Draw_Arc(black, red, x1, y1, arc_width, arc_width, angle1, angle2);
  d->Draw_Arc(black, red, x1, y2, arc_width, arc_width, angle1, angle2);
  d->Draw_Arc(black, red, x2, y1, arc_width, arc_width, angle1, angle2);
  d->Draw_Arc(black, red, x2, y2, arc_width, arc_width, angle1, angle2);

  int xx1 = x1 + half_width;
  int xx2 = x2 + half_width;
  int yy1 = y1 + half_width;
  int yy2 = y2 + half_width;
  d->Draw_Line(red, xx1, yy1, xx2, yy1);
  d->Draw_Line(red, xx1, yy1, xx1, yy2);
  d->Draw_Line(red, xx1, yy2, xx2, yy2);
  d->Draw_Line(red, xx2, yy1, xx2, yy2);
}